

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::SharedMemoryArbiterImpl::FlushPendingCommitDataRequests
          (SharedMemoryArbiterImpl *this,function<void_()> *callback)

{
  ushort size;
  uint uVar1;
  TaskRunner *pTVar2;
  pointer pCVar3;
  ProducerEndpoint *pPVar4;
  _Manager_type p_Var5;
  uint8_t chunk_idx;
  undefined8 uVar6;
  int iVar7;
  CommitDataRequest_ChunksToMove *ctm;
  pointer pCVar8;
  unique_ptr<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
  *puVar9;
  CommitDataRequest *pCVar10;
  unique_lock<std::mutex> scoped_lock;
  Chunk chunk;
  unique_lock<std::mutex> local_148;
  _Any_data local_138;
  _Manager_type local_128;
  _Invoker_type local_120;
  unique_ptr<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
  *local_118;
  function<void_()> *local_110;
  SharedMemoryABI *local_108;
  undefined1 local_100 [16];
  function<void_()> local_f0 [2];
  undefined8 *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  _Any_data local_70;
  code *local_60;
  Chunk local_50;
  Chunk local_40;
  
  local_148._M_device = &this->lock_;
  local_148._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_148);
  local_148._M_owns = true;
  if (this->fully_bound_ == false) {
    if ((callback->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
                (&this->pending_flush_callbacks_,callback);
    }
    goto LAB_0029fbaf;
  }
  pTVar2 = this->task_runner_;
  iVar7 = (*pTVar2->_vptr_TaskRunner[6])(pTVar2);
  if ((char)iVar7 != '\0') {
    if ((this->commit_data_req_)._M_t.
        super___uniq_ptr_impl<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
        ._M_t.
        super__Tuple_impl<0UL,_perfetto::protos::gen::CommitDataRequest_*,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
        .super__Head_base<0UL,_perfetto::protos::gen::CommitDataRequest_*,_false>._M_head_impl ==
        (CommitDataRequest *)0x0) {
      std::unique_lock<std::mutex>::~unique_lock(&local_148);
    }
    else {
      ReplaceCommitPlaceholderBufferIdsLocked(this);
      pCVar10 = (this->commit_data_req_)._M_t.
                super___uniq_ptr_impl<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
                ._M_t.
                super__Tuple_impl<0UL,_perfetto::protos::gen::CommitDataRequest_*,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
                .super__Head_base<0UL,_perfetto::protos::gen::CommitDataRequest_*,_false>.
                _M_head_impl;
      pCVar8 = (pCVar10->chunks_to_move_).
               super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar3 = (pCVar10->chunks_to_move_).
               super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar9 = &this->commit_data_req_;
      if (pCVar8 != pCVar3) {
        local_108 = &this->shmem_abi_;
        local_118 = &this->commit_data_req_;
        local_110 = callback;
        do {
          uVar1 = *(uint *)((this->shmem_abi_).start_ +
                           (ulong)pCVar8->page_ * (this->shmem_abi_).page_size_);
          chunk_idx = (uint8_t)pCVar8->chunk_;
          if ((uVar1 >> (chunk_idx * '\x02' & 0x1f) & 3) == 1) {
            size = *(ushort *)
                    ((long)(this->shmem_abi_).chunk_sizes_._M_elems + (ulong)(uVar1 >> 0x1b & 0xe));
            SharedMemoryABI::Chunk::Chunk
                      (&local_40,
                       (this->shmem_abi_).start_ +
                       (ulong)size * (ulong)pCVar8->chunk_ +
                       (ulong)pCVar8->page_ * (this->shmem_abi_).page_size_ + 8,size,chunk_idx);
            SharedMemoryABI::Chunk::Chunk(&local_50,&local_40);
            SharedMemoryABI::Chunk::Chunk((Chunk *)local_100,&local_50);
            SharedMemoryABI::ReleaseChunk(local_108,(Chunk *)local_100,kChunkComplete);
          }
          pCVar8 = pCVar8 + 1;
        } while (pCVar8 != pCVar3);
        pCVar10 = (local_118->_M_t).
                  super___uniq_ptr_impl<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_perfetto::protos::gen::CommitDataRequest_*,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
                  .super__Head_base<0UL,_perfetto::protos::gen::CommitDataRequest_*,_false>.
                  _M_head_impl;
        puVar9 = local_118;
        callback = local_110;
      }
      (puVar9->_M_t).
      super___uniq_ptr_impl<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
      ._M_t.
      super__Tuple_impl<0UL,_perfetto::protos::gen::CommitDataRequest_*,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
      .super__Head_base<0UL,_perfetto::protos::gen::CommitDataRequest_*,_false>._M_head_impl =
           (CommitDataRequest *)0x0;
      puVar9[1] = (__uniq_ptr_data<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>,_true,_true>
                   )0x0;
      std::unique_lock<std::mutex>::~unique_lock(&local_148);
      if (pCVar10 != (CommitDataRequest *)0x0) {
        pPVar4 = this->producer_endpoint_;
        ::std::function<void_()>::function
                  ((function<void_()> *)&local_70,(function<void_()> *)callback);
        (*pPVar4->_vptr_ProducerEndpoint[7])(pPVar4,pCVar10,&local_70);
        if (local_60 != (code *)0x0) {
          (*local_60)(&local_70,&local_70,__destroy_functor);
        }
        (*(pCVar10->super_CppMessageObj)._vptr_CppMessageObj[1])(pCVar10);
        return;
      }
    }
    if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
      return;
    }
    pPVar4 = this->producer_endpoint_;
    protos::gen::CommitDataRequest::CommitDataRequest((CommitDataRequest *)local_100);
    local_138._M_unused._M_object = (void *)0x0;
    local_138._8_8_ = 0;
    local_128 = (_Manager_type)0x0;
    local_120 = callback->_M_invoker;
    p_Var5 = (callback->super__Function_base)._M_manager;
    if (p_Var5 != (_Manager_type)0x0) {
      local_138._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
      local_138._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
      (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
      callback->_M_invoker = (_Invoker_type)0x0;
      local_128 = p_Var5;
    }
    (*pPVar4->_vptr_ProducerEndpoint[7])(pPVar4,local_100,&local_138);
    if (local_128 != (_Manager_type)0x0) {
      (*local_128)(&local_138,&local_138,__destroy_functor);
    }
    protos::gen::CommitDataRequest::~CommitDataRequest((CommitDataRequest *)local_100);
    return;
  }
  std::unique_lock<std::mutex>::unlock(&local_148);
  local_100._0_8_ =
       (this->weak_ptr_factory_).weak_ptr_.handle_.
       super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar8 = (pointer)(this->weak_ptr_factory_).weak_ptr_.handle_.
                    super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
  if (pCVar8 == (pointer)0x0) {
    local_100._8_8_ = (pointer)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pCVar8->page_ = pCVar8->page_ + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        pCVar8->page_ = pCVar8->page_ + 1;
        UNLOCK();
        local_100._8_8_ = pCVar8;
        goto LAB_0029faad;
      }
    }
    else {
      pCVar8->page_ = pCVar8->page_ + 1;
    }
    pCVar8->page_ = pCVar8->page_ + 1;
    local_100._8_8_ = pCVar8;
  }
LAB_0029faad:
  ::std::function<void_()>::function(local_f0,(function<void_()> *)callback);
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98 = (undefined8 *)0x0;
  uStack_90 = 0;
  local_98 = (undefined8 *)operator_new(0x30);
  uVar6 = local_100._8_8_;
  *local_98 = local_100._0_8_;
  local_100._8_8_ = (pointer)0x0;
  local_98[1] = uVar6;
  local_100._0_8_ = (_func_int **)0x0;
  local_98[4] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[5] = local_f0[0]._M_invoker;
  if ((pointer)local_f0[0].super__Function_base._M_manager != (pointer)0x0) {
    local_98[2] = local_f0[0].super__Function_base._M_functor._M_unused._M_object;
    local_98[3] = local_f0[0].super__Function_base._M_functor._8_8_;
    local_98[4] = local_f0[0].super__Function_base._M_manager;
    local_f0[0].super__Function_base._M_manager = (_Manager_type)0x0;
    local_f0[0]._M_invoker = (_Invoker_type)0x0;
  }
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:38782:29)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:38782:29)>
             ::_M_manager;
  (*pTVar2->_vptr_TaskRunner[2])(pTVar2);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  if ((pointer)local_f0[0].super__Function_base._M_manager != (pointer)0x0) {
    (*local_f0[0].super__Function_base._M_manager)(local_f0,local_f0,3);
  }
  if ((pointer)local_100._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
  }
  if (pCVar8 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar8);
  }
LAB_0029fbaf:
  std::unique_lock<std::mutex>::~unique_lock(&local_148);
  return;
}

Assistant:

void SharedMemoryArbiterImpl::FlushPendingCommitDataRequests(
    std::function<void()> callback) {
  std::unique_ptr<CommitDataRequest> req;
  {
    std::unique_lock<std::mutex> scoped_lock(lock_);

    // Flushing is only supported while |fully_bound_|, and there may still be
    // unbound startup trace writers. If so, skip the commit for now - it'll be
    // done when |fully_bound_| is updated.
    if (!fully_bound_) {
      if (callback)
        pending_flush_callbacks_.push_back(callback);
      return;
    }

    // May be called by TraceWriterImpl on any thread.
    base::TaskRunner* task_runner = task_runner_;
    if (!task_runner->RunsTasksOnCurrentThread()) {
      // We shouldn't post a task while holding a lock. |task_runner| remains
      // valid after unlocking, because |task_runner_| is never reset.
      scoped_lock.unlock();

      auto weak_this = weak_ptr_factory_.GetWeakPtr();
      task_runner->PostTask([weak_this, callback] {
        if (weak_this)
          weak_this->FlushPendingCommitDataRequests(std::move(callback));
      });
      return;
    }

    // |commit_data_req_| could have become a nullptr, for example when a forced
    // sync flush happens in GetNewChunk().
    if (commit_data_req_) {
      // Make sure any placeholder buffer IDs from StartupWriters are replaced
      // before sending the request.
      bool all_placeholders_replaced =
          ReplaceCommitPlaceholderBufferIdsLocked();
      // We're |fully_bound_|, thus all writers are bound and all placeholders
      // should have been replaced.
      PERFETTO_DCHECK(all_placeholders_replaced);

      // In order to allow patching in the producer we delay the kChunkComplete
      // transition and keep batched chunks in the kChunkBeingWritten state.
      // Since we are about to notify the service of all batched chunks, it will
      // not be possible to apply any more patches to them and we need to move
      // them to kChunkComplete - otherwise the service won't look at them.
      for (auto& ctm : commit_data_req_->chunks_to_move()) {
        uint32_t layout = shmem_abi_.GetPageLayout(ctm.page());
        auto chunk_state =
            shmem_abi_.GetChunkStateFromLayout(layout, ctm.chunk());
        // Note: the subset of |commit_data_req_| chunks that still need
        // patching is also the subset of chunks that are still being written
        // to. The rest of the chunks in |commit_data_req_| do not need patching
        // and have already been marked as complete.
        if (chunk_state != SharedMemoryABI::kChunkBeingWritten)
          continue;

        SharedMemoryABI::Chunk chunk =
            shmem_abi_.GetChunkUnchecked(ctm.page(), layout, ctm.chunk());
        shmem_abi_.ReleaseChunkAsComplete(std::move(chunk));
      }

      req = std::move(commit_data_req_);
      bytes_pending_commit_ = 0;
    }
  }  // scoped_lock

  if (req) {
    producer_endpoint_->CommitData(*req, callback);
  } else if (callback) {
    // If |req| was nullptr, it means that an enqueued deferred commit was
    // executed just before this. At this point send an empty commit request
    // to the service, just to linearize with it and give the guarantee to the
    // caller that the data has been flushed into the service.
    producer_endpoint_->CommitData(CommitDataRequest(), std::move(callback));
  }
}